

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stop_Freeze_R_PDU.cpp
# Opt level: O3

KString * __thiscall
KDIS::PDU::Stop_Freeze_R_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Stop_Freeze_R_PDU *this)

{
  ostream *poVar1;
  ostream *poVar2;
  ulong uVar3;
  KINT32 Value;
  KINT32 Value_00;
  ushort uVar4;
  KStringStream ss;
  KString local_400;
  KString local_3e0;
  KString local_3c0;
  long *local_3a0;
  long local_398;
  long local_390 [2];
  KString local_380;
  KString local_360;
  undefined1 local_340 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330 [7];
  ios_base local_2c0 [264];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  Header7::GetAsString_abi_cxx11_(&local_360,(Header7 *)this);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_360._M_dataplus._M_p,local_360._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"-Stop/Freeze-R PDU-\n",0x14);
  Simulation_Management_Header::GetAsString_abi_cxx11_
            (&local_380,(Simulation_Management_Header *)this);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_380._M_dataplus._M_p,local_380._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Real World Time:\n",0x11);
  DATA_TYPE::ClockTime::GetAsString_abi_cxx11_
            (&local_3e0,&(this->super_Stop_Freeze_PDU).m_RealWorldTime);
  std::__cxx11::stringstream::stringstream((stringstream *)local_340);
  poVar1 = (ostream *)(local_340 + 0x10);
  local_400._M_dataplus._M_p._0_1_ = '\t';
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_400,1);
  if (local_3e0._M_string_length != 0) {
    uVar4 = 1;
    uVar3 = 0;
    do {
      local_400._M_dataplus._M_p._0_1_ = local_3e0._M_dataplus._M_p[uVar3];
      if ((local_3e0._M_string_length - 1 == uVar3) || ((char)local_400._M_dataplus._M_p != '\n')) {
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_400,1);
      }
      else {
        local_400._M_dataplus._M_p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_400,1);
        local_400._M_dataplus._M_p._0_1_ = '\t';
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_400,1);
      }
      uVar3 = (ulong)uVar4;
      uVar4 = uVar4 + 1;
    } while (uVar3 < local_3e0._M_string_length);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
  std::ios_base::~ios_base(local_2c0);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_3a0,local_398);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\tReason:           ",0x13);
  DATA_TYPE::ENUMS::GetEnumAsStringStopFreezeReason_abi_cxx11_
            ((KString *)local_340,(ENUMS *)(ulong)(this->super_Stop_Freeze_PDU).m_ui8Reason,Value);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(char *)local_340._0_8_,local_340._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n\tFrozen Behavior:  ",0x14);
  DATA_TYPE::ENUMS::GetEnumAsStringFrozenBehavior_abi_cxx11_
            (&local_400,(ENUMS *)(ulong)(this->super_Stop_Freeze_PDU).m_ui8FrozenBehaviour,Value_00)
  ;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(char *)CONCAT71(local_400._M_dataplus._M_p._1_7_,
                                              (char)local_400._M_dataplus._M_p),
                      local_400._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  Reliability_Header::GetAsString_abi_cxx11_(&local_3c0,&this->super_Reliability_Header);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_3c0._M_dataplus._M_p,local_3c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n\tRequest ID:       ",0x14);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
    operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_400._M_dataplus._M_p._1_7_,(char)local_400._M_dataplus._M_p) !=
      &local_400.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_400._M_dataplus._M_p._1_7_,(char)local_400._M_dataplus._M_p),
                    local_400.field_2._M_allocated_capacity + 1);
  }
  if ((ostream *)local_340._0_8_ != poVar1) {
    operator_delete((void *)local_340._0_8_,local_330[0]._M_allocated_capacity + 1);
  }
  if (local_3a0 != local_390) {
    operator_delete(local_3a0,local_390[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
    operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != &local_380.field_2) {
    operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

KString Stop_Freeze_R_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Stop/Freeze-R PDU-\n"
       << Simulation_Management_Header::GetAsString()
       << "Real World Time:\n"
       << IndentString( m_RealWorldTime.GetAsString(), 1 )
       << "\tReason:           " << GetEnumAsStringStopFreezeReason( m_ui8Reason )
       << "\n\tFrozen Behavior:  " << GetEnumAsStringFrozenBehavior( m_ui8FrozenBehaviour )
       << "\n" << Reliability_Header::GetAsString()
       << "\n\tRequest ID:       " << m_ui32RequestID
       << "\n";

    return ss.str();
}